

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void vdbeMemClear(Mem *p)

{
  if ((p->flags & 0x2400) != 0) {
    vdbeMemClearExternAndSetNull(p);
  }
  if (p->szMalloc != 0) {
    sqlite3DbFreeNN(p->db,p->zMalloc);
    p->szMalloc = 0;
  }
  p->z = (char *)0x0;
  return;
}

Assistant:

static SQLITE_NOINLINE void vdbeMemClear(Mem *p){
  if( VdbeMemDynamic(p) ){
    vdbeMemClearExternAndSetNull(p);
  }
  if( p->szMalloc ){
    sqlite3DbFreeNN(p->db, p->zMalloc);
    p->szMalloc = 0;
  }
  p->z = 0;
}